

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::anon_unknown_0::CWriter::DefineImportName
          (string *__return_storage_ptr__,CWriter *this,string *name,string_view module,
          string_view mangled_field_name)

{
  string_view name_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  _Base_ptr local_110;
  undefined1 local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  string local_a0;
  CWriter *local_80;
  char *local_78;
  string local_70;
  undefined1 local_50 [8];
  string mangled;
  string *name_local;
  CWriter *this_local;
  string_view module_local;
  
  local_78 = (char *)module.size_;
  name_00.size_ = (CWriter *)module.data_;
  name_00.data_ = local_78;
  local_80 = name_00.size_;
  mangled.field_2._8_8_ = name;
  (anonymous_namespace)::CWriter::MangleName_abi_cxx11_(&local_70,name_00.size_,name_00);
  string_view::to_string_abi_cxx11_(&local_a0,&mangled_field_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->import_syms_,(value_type *)mangled.field_2._8_8_);
  local_b0 = (_Base_ptr)pVar1.first._M_node;
  local_a8 = pVar1.second;
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->global_syms_,(value_type *)local_50);
  local_c0 = (_Base_ptr)pVar1.first._M_node;
  local_b8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             mangled.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::insert(&this->global_sym_map_,&local_100);
  local_110 = (_Base_ptr)pVar2.first._M_node;
  local_108 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_100);
  std::operator+(&local_130,"(*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(__return_storage_ptr__,&local_130,")");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineImportName(const std::string& name,
                                      string_view module,
                                      string_view mangled_field_name) {
  std::string mangled = MangleName(module) + mangled_field_name.to_string();
  import_syms_.insert(name);
  global_syms_.insert(mangled);
  global_sym_map_.insert(SymbolMap::value_type(name, mangled));
  return "(*" + mangled + ")";
}